

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O1

string * __thiscall
t_swift_generator::declare_property_abi_cxx11_
          (string *__return_storage_ptr__,t_swift_generator *this,t_field *tfield,bool is_private)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  undefined7 in_register_00000009;
  char *pcVar4;
  ulong uVar5;
  char *__s;
  string visibility;
  ostringstream render;
  string local_1e0;
  char *local_1c0;
  long local_1b8;
  char local_1b0 [16];
  undefined1 local_1a0 [376];
  
  pcVar4 = "fileprivate";
  if ((this->gen_cocoa_ & 1U) != 0) {
    pcVar4 = "private";
  }
  __s = "public";
  if ((int)CONCAT71(in_register_00000009,is_private) != 0) {
    __s = pcVar4;
  }
  local_1c0 = local_1b0;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,__s,__s + sVar2);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,local_1c0,local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," var ",5);
  maybe_escape_identifier(&local_1e0,this,&tfield->name_);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  bVar1 = field_is_optional(this,tfield);
  uVar5 = (ulong)this->gen_cocoa_;
  if (bVar1) {
    pcVar4 = "";
    if (uVar5 != 0) {
      pcVar4 = " ";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar4,uVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,": ",2);
    type_name_abi_cxx11_(&local_1e0,this,tfield->type_,true,false);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  }
  else if (uVar5 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,": ",2);
    type_name_abi_cxx11_(&local_1e0,this,tfield->type_,false,false);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," = ",3);
    type_name_abi_cxx11_(&local_1e0,this,tfield->type_,false,false);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"()",2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_swift_generator::declare_property(t_field* tfield, bool is_private) {

  string visibility = is_private ? (gen_cocoa_ ? "private" : "fileprivate") : "public";

  ostringstream render;

  render << visibility << " var " << maybe_escape_identifier(tfield->get_name());

  if (field_is_optional(tfield)) {
    render << (gen_cocoa_ ? " " : "") << ": " << type_name(tfield->get_type(), true);
  }
  else {
    if (!gen_cocoa_) {
      render << ": " << type_name(tfield->get_type(), false);
    } else {
      // Swift2/Cocoa backward compat, Bad, default init
      render << " = " << type_name(tfield->get_type(), false) << "()";
    }
  }

  return render.str();
}